

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.cpp
# Opt level: O0

void test_std_intersect<std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>
               (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *values)

{
  bool bVar1;
  const_reference __x;
  const_iterator cVar2;
  __normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  Begin;
  size_type sVar3;
  iterator __first1;
  iterator __last1;
  const_iterator __first2;
  const_iterator __last2;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> __result;
  clock_t cVar4;
  ostream *poVar5;
  size_type sVar6;
  undefined1 local_a0 [8];
  value_type result;
  vector<long,_std::allocator<long>_> *row;
  __normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  __end0;
  __normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
  __begin0;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_48;
  iterator_range_base<__gnu_cxx::__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  *local_38;
  iterator_range<__gnu_cxx::__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>_>
  *__range1;
  clock_t intersect_time;
  value_type intersected;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *values_local;
  
  intersected.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)values;
  __x = std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::front(values);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&intersect_time,__x);
  __range1 = (iterator_range<__gnu_cxx::__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>_>
              *)clock();
  cVar2 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)intersected.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  Begin = std::
          next<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>const*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
                    ((__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                      )cVar2._M_current,1);
  cVar2 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)intersected.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  local_48 = (iterator_range_base<__gnu_cxx::__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
              )boost::
               make_iterator_range<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>const*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>>
                         (Begin,(__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                                 )cVar2._M_current);
  local_38 = &local_48;
  __end0 = boost::iterator_range_detail::
           iterator_range_base<__gnu_cxx::__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
           ::begin(local_38);
  row = (vector<long,_std::allocator<long>_> *)
        boost::iterator_range_detail::
        iterator_range_base<__gnu_cxx::__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
        ::end(local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                                *)&row);
    if (!bVar1) break;
    result.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
                  ::operator*(&__end0);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_a0);
    sVar6 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)&intersect_time);
    sVar3 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)
                       result.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    std::vector<long,_std::allocator<long>_>::reserve
              ((vector<long,_std::allocator<long>_> *)local_a0,sVar6 + sVar3);
    __first1 = std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)&intersect_time);
    __last1 = std::vector<long,_std::allocator<long>_>::end
                        ((vector<long,_std::allocator<long>_> *)&intersect_time);
    __first2 = std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)
                          result.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    __last2 = std::vector<long,_std::allocator<long>_>::end
                        ((vector<long,_std::allocator<long>_> *)
                         result.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    __result = std::back_inserter<std::vector<long,std::allocator<long>>>
                         ((vector<long,_std::allocator<long>_> *)local_a0);
    std::
    set_intersection<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,std::back_insert_iterator<std::vector<long,std::allocator<long>>>>
              ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               __first1._M_current,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
               __last1._M_current,
               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
               __first2._M_current,
               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
               __last2._M_current,__result);
    std::swap<long,std::allocator<long>>
              ((vector<long,_std::allocator<long>_> *)local_a0,
               (vector<long,_std::allocator<long>_> *)&intersect_time);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_a0);
    __gnu_cxx::
    __normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
    ::operator++(&__end0);
  }
  cVar4 = clock();
  __range1 = (iterator_range<__gnu_cxx::__normal_iterator<const_std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>_>
              *)(cVar4 - (long)__range1);
  poVar5 = std::operator<<((ostream *)&std::cout,"std::set_intersection: ");
  sVar6 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)&intersect_time);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\t");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)(long)__range1 / 1000000.0);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)&intersect_time);
  return;
}

Assistant:

void test_std_intersect (const Container & values)
{
    typename Container::value_type intersected(values.front());

    clock_t intersect_time = clock();
    for (const auto & row: boost::make_iterator_range(std::next(values.begin()), values.end()))
    {
        typename Container::value_type result;
        result.reserve(intersected.size() + row.size());
        std::set_intersection(intersected.begin(), intersected.end(), row.begin(), row.end(), std::back_inserter(result));
        std::swap(result, intersected);
    }
    intersect_time = clock() - intersect_time;

    std::cout << "std::set_intersection: " << intersected.size() << std::endl;
    std::cout << "\t" << static_cast<double>(intersect_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}